

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

bool __thiscall
duckdb::RowGroupCollection::ScheduleVacuumTasks
          (RowGroupCollection *this,CollectionCheckpointState *checkpoint_state,VacuumState *state,
          idx_t segment_idx,bool schedule_vacuum)

{
  vector<unsigned_long,_true> *this_00;
  element_type *peVar1;
  reference pvVar2;
  BaseExecutorTask *this_01;
  type executor;
  pointer this_02;
  TaskExecutor *pTVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  size_type sVar6;
  TaskExecutor *pTVar7;
  bool bVar8;
  _Head_base<0UL,_duckdb::Task_*,_false> local_40;
  idx_t local_38;
  
  if (state->can_vacuum_deletes == true) {
    if (segment_idx < state->next_vacuum_idx) {
      return true;
    }
    this_00 = &state->row_group_counts;
    pvVar2 = vector<unsigned_long,_true>::operator[](this_00,segment_idx);
    if (schedule_vacuum && *pvVar2 != 0) {
      local_38 = this->row_group_size;
      pTVar3 = (TaskExecutor *)&DAT_00000001;
      bVar8 = true;
      do {
        sVar6 = segment_idx;
        if (segment_idx <
            (ulong)((long)(checkpoint_state->segments->
                          super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                          ).
                          super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(checkpoint_state->segments->
                          super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                          ).
                          super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          uVar4 = (long)pTVar3 * local_38;
          pp_Var5 = (_func_int **)0x0;
          pTVar7 = (TaskExecutor *)0x0;
          do {
            pvVar2 = vector<unsigned_long,_true>::operator[](this_00,sVar6);
            if (*pvVar2 != 0) {
              pvVar2 = vector<unsigned_long,_true>::operator[](this_00,sVar6);
              if (uVar4 < *pvVar2 + (long)pp_Var5) break;
              pvVar2 = vector<unsigned_long,_true>::operator[](this_00,sVar6);
              pp_Var5 = (_func_int **)((long)pp_Var5 + *pvVar2);
              pTVar7 = (TaskExecutor *)((long)&pTVar7->scheduler + 1);
            }
            sVar6 = sVar6 + 1;
          } while (sVar6 < (ulong)((long)(checkpoint_state->segments->
                                         super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                         ).
                                         super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(checkpoint_state->segments->
                                         super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                         ).
                                         super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        else {
          pTVar7 = (TaskExecutor *)0x0;
          pp_Var5 = (_func_int **)0x0;
        }
        if (pTVar3 < pTVar7) goto LAB_017966d3;
        bVar8 = pTVar3 < (TaskExecutor *)0x3;
        pTVar3 = (TaskExecutor *)((long)&pTVar3->scheduler + 1);
      } while (pTVar3 != (TaskExecutor *)0x4);
      pTVar3 = (TaskExecutor *)0x4;
LAB_017966d3:
      if (bVar8) {
        this_01 = (BaseExecutorTask *)operator_new(0x60);
        peVar1 = (element_type *)state->row_start;
        executor = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>
                   ::operator*(&checkpoint_state->executor);
        BaseExecutorTask::BaseExecutorTask(this_01,executor);
        this_01[1].super_Task._vptr_Task = (_func_int **)checkpoint_state;
        (this_01->super_Task)._vptr_Task = (_func_int **)&PTR__Task_02472550;
        this_01[1].super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
        super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)state;
        this_01[1].super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
        super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)segment_idx;
        this_01[1].super_Task.token.ptr = (ProducerToken *)pTVar7;
        this_01[1].executor = pTVar3;
        this_01[2].super_Task._vptr_Task = pp_Var5;
        this_01[2].super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
        super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
        this_02 = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>
                  ::operator->(&checkpoint_state->executor);
        local_40._M_head_impl = (Task *)this_01;
        TaskExecutor::ScheduleTask
                  (this_02,(unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)
                           &local_40);
        if ((BaseExecutorTask *)local_40._M_head_impl != (BaseExecutorTask *)0x0) {
          (*((Task *)&(local_40._M_head_impl)->_vptr_Task)->_vptr_Task[1])();
        }
        state->next_vacuum_idx = sVar6;
        state->row_start = state->row_start + (long)pp_Var5;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RowGroupCollection::ScheduleVacuumTasks(CollectionCheckpointState &checkpoint_state, VacuumState &state,
                                             idx_t segment_idx, bool schedule_vacuum) {
	static constexpr const idx_t MAX_MERGE_COUNT = 3;

	if (!state.can_vacuum_deletes) {
		// we cannot vacuum deletes - cannot vacuum
		return false;
	}
	if (segment_idx < state.next_vacuum_idx) {
		// this segment is being vacuumed by a previously scheduled task
		return true;
	}
	if (state.row_group_counts[segment_idx] == 0) {
		// segment was already dropped - skip
		D_ASSERT(!checkpoint_state.segments[segment_idx].node);
		return false;
	}
	if (!schedule_vacuum) {
		return false;
	}
	idx_t merge_rows;
	idx_t next_idx = 0;
	idx_t merge_count;
	idx_t target_count;
	bool perform_merge = false;
	// check if we can merge row groups adjacent to the current segment_idx
	// we try merging row groups into batches of 1-3 row groups
	// our goal is to reduce the amount of row groups
	// hence we target_count should be less than merge_count for a marge to be worth it
	// we greedily prefer to merge to the lowest target_count
	// i.e. we prefer to merge 2 row groups into 1, than 3 row groups into 2
	const idx_t row_group_size = GetRowGroupSize();
	for (target_count = 1; target_count <= MAX_MERGE_COUNT; target_count++) {
		auto total_target_size = target_count * row_group_size;
		merge_count = 0;
		merge_rows = 0;
		for (next_idx = segment_idx; next_idx < checkpoint_state.segments.size(); next_idx++) {
			if (state.row_group_counts[next_idx] == 0) {
				continue;
			}
			if (merge_rows + state.row_group_counts[next_idx] > total_target_size) {
				// does not fit
				break;
			}
			// we can merge this row group together with the other row group
			merge_rows += state.row_group_counts[next_idx];
			merge_count++;
		}
		if (target_count < merge_count) {
			// we can reduce "merge_count" row groups to "target_count"
			// perform the merge at this level
			perform_merge = true;
			break;
		}
	}
	if (!perform_merge) {
		return false;
	}
	// schedule the vacuum task
	auto vacuum_task = make_uniq<VacuumTask>(checkpoint_state, state, segment_idx, merge_count, target_count,
	                                         merge_rows, state.row_start);
	checkpoint_state.executor->ScheduleTask(std::move(vacuum_task));
	// skip vacuuming by the row groups we have merged
	state.next_vacuum_idx = next_idx;
	state.row_start += merge_rows;
	return true;
}